

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_dec_ref_base_pic_marking(nal_t *nal,bs_t *b)

{
  byte *pbVar1;
  prefix_nal_svc_t *ppVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  
  uVar8 = b->bits_left - 1;
  b->bits_left = uVar8;
  pbVar5 = b->p;
  pbVar1 = b->end;
  bVar12 = false;
  if (pbVar5 < pbVar1) {
    bVar12 = (*pbVar5 >> (uVar8 & 0x1f) & 1) != 0;
  }
  if (uVar8 == 0) {
    pbVar5 = pbVar5 + 1;
    b->p = pbVar5;
    b->bits_left = 8;
    uVar8 = 8;
  }
  ppVar2 = nal->prefix_nal_svc;
  ppVar2->adaptive_ref_base_pic_marking_mode_flag = bVar12;
  if (bVar12) {
    uVar6 = 0;
    do {
      while( true ) {
        do {
          uVar4 = uVar6;
          uVar8 = uVar8 - 1;
          b->bits_left = uVar8;
          bVar12 = true;
          if (pbVar5 < pbVar1) {
            bVar12 = (*pbVar5 >> (uVar8 & 0x1f) & 1) == 0;
          }
          if (uVar8 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar8 = 8;
          }
        } while (((bool)(bVar12 & uVar4 < 0x20)) && (uVar6 = uVar4 + 1, pbVar5 < pbVar1));
        if (uVar4 == 0) {
          uVar6 = 0;
        }
        else {
          uVar6 = 0;
          uVar3 = uVar4;
          do {
            uVar3 = uVar3 - 1;
            uVar8 = uVar8 - 1;
            b->bits_left = uVar8;
            uVar9 = 0;
            if (pbVar5 < pbVar1) {
              uVar9 = (uint)((*pbVar5 >> (uVar8 & 0x1f) & 1) != 0);
            }
            if (uVar8 == 0) {
              pbVar5 = pbVar5 + 1;
              b->p = pbVar5;
              b->bits_left = 8;
              uVar8 = 8;
            }
            uVar6 = uVar6 | uVar9 << ((byte)uVar3 & 0x1f);
          } while (uVar3 != 0);
        }
        iVar10 = ~(-1 << ((byte)uVar4 & 0x1f)) + uVar6;
        ppVar2->memory_management_base_control_operation = iVar10;
        if (iVar10 != 1) break;
        uVar6 = 0xffffffff;
        iVar10 = -2;
        do {
          iVar11 = iVar10;
          uVar4 = uVar6;
          uVar8 = uVar8 - 1;
          b->bits_left = uVar8;
          bVar12 = true;
          if (pbVar5 < pbVar1) {
            bVar12 = (*pbVar5 >> (uVar8 & 0x1f) & 1) == 0;
          }
          if (uVar8 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar8 = 8;
          }
          uVar6 = uVar4 + 1;
        } while (((bool)(bVar12 & uVar6 < 0x20)) && (iVar10 = iVar11 + 1, pbVar5 < pbVar1));
        uVar3 = 0;
        if (uVar6 != 0) {
          do {
            uVar8 = uVar8 - 1;
            b->bits_left = uVar8;
            uVar9 = 0;
            if (pbVar5 < pbVar1) {
              uVar9 = (uint)((*pbVar5 >> (uVar8 & 0x1f) & 1) != 0);
            }
            if (uVar8 == 0) {
              pbVar5 = pbVar5 + 1;
              b->p = pbVar5;
              b->bits_left = 8;
              uVar8 = 8;
            }
            uVar3 = uVar3 | uVar9 << ((byte)uVar4 & 0x1f);
            uVar4 = uVar4 - 1;
            iVar11 = iVar11 + -1;
          } while (iVar11 != -2);
        }
        ppVar2->difference_of_base_pic_nums_minus1 = ~(-1 << ((byte)uVar6 & 0x1f)) + uVar3;
        uVar6 = 0;
      }
      if (iVar10 == 2) {
        uVar6 = 0xffffffff;
        iVar11 = -2;
        do {
          iVar7 = iVar11;
          uVar4 = uVar6;
          uVar8 = uVar8 - 1;
          b->bits_left = uVar8;
          bVar12 = true;
          if (pbVar5 < pbVar1) {
            bVar12 = (*pbVar5 >> (uVar8 & 0x1f) & 1) == 0;
          }
          if (uVar8 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar8 = 8;
          }
          uVar6 = uVar4 + 1;
        } while (((bool)(bVar12 & uVar6 < 0x20)) && (iVar11 = iVar7 + 1, pbVar5 < pbVar1));
        uVar3 = 0;
        if (uVar6 != 0) {
          do {
            uVar8 = uVar8 - 1;
            b->bits_left = uVar8;
            uVar9 = 0;
            if (pbVar5 < pbVar1) {
              uVar9 = (uint)((*pbVar5 >> (uVar8 & 0x1f) & 1) != 0);
            }
            if (uVar8 == 0) {
              pbVar5 = pbVar5 + 1;
              b->p = pbVar5;
              b->bits_left = 8;
              uVar8 = 8;
            }
            uVar3 = uVar3 | uVar9 << ((byte)uVar4 & 0x1f);
            uVar4 = uVar4 - 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != -2);
        }
        ppVar2->long_term_base_pic_num = ~(-1 << ((byte)uVar6 & 0x1f)) + uVar3;
      }
      uVar6 = 0;
    } while (iVar10 != 0);
  }
  return;
}

Assistant:

void read_dec_ref_base_pic_marking(nal_t* nal, bs_t* b)
{
    nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag = bs_read_u1(b);
    if( nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag )
    {
        do {
            nal->prefix_nal_svc->memory_management_base_control_operation = bs_read_ue(b);
            
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 1 )
            {
                nal->prefix_nal_svc->difference_of_base_pic_nums_minus1 = bs_read_ue(b);
            }
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 2 )
            {
                nal->prefix_nal_svc->long_term_base_pic_num = bs_read_ue(b);
            }
        } while( nal->prefix_nal_svc->memory_management_base_control_operation != 0 );
    }
}